

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestMembraneImpl::TestMembraneImpl(TestMembraneImpl *this)

{
  TestMembraneImpl *this_local;
  
  Capability::Server::Server((Server *)&(this->super_Server).field_0x8);
  capnproto_test::capnp::test::TestMembrane::Server::Server
            (&this->super_Server,&PTR_construction_vtable_24__00d73ea8);
  (this->super_Server)._vptr_Server = (_func_int **)0xd73e30;
  *(undefined8 *)&(this->super_Server).field_0x8 = 0xd73e88;
  return;
}

Assistant:

class TestMembraneImpl final: public test::TestMembrane::Server {
protected:
  kj::Promise<void> makeThing(MakeThingContext context) override {
    context.getResults().setThing(kj::heap<ThingImpl>("inside"));
    return kj::READY_NOW;
  }

  kj::Promise<void> callPassThrough(CallPassThroughContext context) override {
    auto params = context.getParams();
    auto req = params.getThing().passThroughRequest();
    if (params.getTailCall()) {
      return context.tailCall(kj::mv(req));
    } else {
      return req.send().then(
          [KJ_CPCAP(context)](Response<test::TestMembrane::Result>&& result) mutable {
        context.setResults(result);
      });
    }
  }

  kj::Promise<void> callIntercept(CallInterceptContext context) override {
    auto params = context.getParams();
    auto req = params.getThing().interceptRequest();
    if (params.getTailCall()) {
      return context.tailCall(kj::mv(req));
    } else {
      return req.send().then(
          [KJ_CPCAP(context)](Response<test::TestMembrane::Result>&& result) mutable {
        context.setResults(result);
      });
    }